

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

void big_file_dtype_format(char *buffer,char *dtype,void *data,char *fmt)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  double dVar4;
  char ndtype [8];
  char ndtype2 [8];
  char converted [128];
  
  pcVar2 = ndtype;
  _dtype_normalize(ndtype2,dtype);
  ndtype2[0] = '=';
  _dtype_normalize(ndtype,ndtype2);
  dtype_convert_simple(converted,ndtype,data,dtype,1);
  pcVar3 = ndtype + 1;
  iVar1 = bcmp(pcVar3,"a1",3);
  if (iVar1 == 0) {
    pcVar3 = "%c";
  }
  else {
    iVar1 = bcmp(pcVar3,"b1",3);
    if (iVar1 != 0) {
      iVar1 = bcmp(pcVar3,"i8",3);
      if (iVar1 == 0) {
        pcVar3 = "%ld";
LAB_001065b2:
        if (fmt != (char *)0x0) {
          pcVar3 = fmt;
        }
        pcVar2 = (char *)CONCAT44(converted._4_4_,converted._0_4_);
LAB_001065bb:
        sprintf(buffer,pcVar3,pcVar2);
        return;
      }
      iVar1 = bcmp(pcVar3,"i4",3);
      if (iVar1 == 0) {
        pcVar3 = "%d";
      }
      else {
        iVar1 = bcmp(pcVar3,"u8",3);
        if (iVar1 == 0) {
          pcVar3 = "%lu";
          goto LAB_001065b2;
        }
        iVar1 = bcmp(pcVar3,"u4",3);
        if (iVar1 != 0) {
          iVar1 = bcmp(pcVar3,"f8",3);
          if (iVar1 == 0) {
            pcVar3 = "%g";
            if (fmt != (char *)0x0) {
              pcVar3 = fmt;
            }
            dVar4 = (double)CONCAT44(converted._4_4_,converted._0_4_);
LAB_00106615:
            sprintf(buffer,pcVar3,dVar4);
            return;
          }
          iVar1 = bcmp(pcVar3,"f4",3);
          if (iVar1 == 0) {
            pcVar3 = "%g";
            if (fmt != (char *)0x0) {
              pcVar3 = fmt;
            }
            dVar4 = (double)(float)converted._0_4_;
            goto LAB_00106615;
          }
          iVar1 = bcmp(pcVar3,"c8",3);
          if (iVar1 == 0) {
            pcVar3 = "%g+%gI";
            if (fmt != (char *)0x0) {
              pcVar3 = fmt;
            }
            dVar4 = (double)(float)converted._0_4_;
            converted._8_8_ = (undefined8)(float)converted._4_4_;
LAB_00106657:
            sprintf(buffer,pcVar3,dVar4,converted._8_8_);
            return;
          }
          if (ndtype._1_4_ == 0x363163) {
            pcVar3 = "%g+%gI";
            if (fmt != (char *)0x0) {
              pcVar3 = fmt;
            }
            dVar4 = (double)CONCAT44(converted._4_4_,converted._0_4_);
            goto LAB_00106657;
          }
          pcVar3 = "<%s>";
          goto LAB_001065bb;
        }
        pcVar3 = "%u";
      }
      if (fmt != (char *)0x0) {
        pcVar3 = fmt;
      }
      goto LAB_00106584;
    }
    pcVar3 = "%d";
  }
  if (fmt != (char *)0x0) {
    pcVar3 = fmt;
  }
  converted._0_4_ = SEXT14(converted[0]);
LAB_00106584:
  sprintf(buffer,pcVar3,(ulong)(uint)converted._0_4_);
  return;
}

Assistant:

void
big_file_dtype_format(char * buffer, const char * dtype, const void * data, const char * fmt)
{
    char ndtype[8];
    char ndtype2[8];
    variant_t p;

    /* handle the endianness stuff in case it is not machine */
    char converted[128];

    _dtype_normalize(ndtype2, dtype);
    ndtype2[0] = '=';
    _dtype_normalize(ndtype, ndtype2);
    dtype_convert_simple(converted, ndtype, data, dtype, 1);

    p.v = converted;
#define FORMAT1(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sprintf(buffer, fmt, *p.dtype); \
    } else
#define FORMAT2(dtype, defaultfmt) \
    if(0 == strcmp(ndtype + 1, # dtype)) { \
        if(fmt == NULL) fmt = defaultfmt; \
        sprintf(buffer, fmt, p.dtype->r, p.dtype->i); \
    } else

    FORMAT1(a1, "%c")
    FORMAT1(b1, "%d")
    FORMAT1(i8, "%ld")
    FORMAT1(i4, "%d")
    FORMAT1(u8, "%lu")
    FORMAT1(u4, "%u")
    FORMAT1(f8, "%g")
    FORMAT1(f4, "%g")
    FORMAT2(c8, "%g+%gI")
    FORMAT2(c16, "%g+%gI")
    {
        sprintf(buffer, "<%s>", ndtype);
    }
}